

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::VecAttributesImpl::setVector
          (VecAttributesImpl *this,RefVectorOf<xercesc_4_0::XMLAttr> *srcVec,XMLSize_t count,
          XMLScanner *scanner,bool adopt)

{
  if ((this->fAdopt == true) && (this->fVector != (RefVectorOf<xercesc_4_0::XMLAttr> *)0x0)) {
    (*(this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>)._vptr_BaseRefVectorOf[1])();
  }
  this->fAdopt = adopt;
  this->fCount = count;
  this->fVector = srcVec;
  this->fScanner = scanner;
  return;
}

Assistant:

void VecAttributesImpl::setVector(const   RefVectorOf<XMLAttr>* const srcVec
                                , const XMLSize_t                count
                                , const XMLScanner * const        scanner
                                , const bool                        adopt)
{
    //
    //  Delete the previous vector (if any) if we are adopting. Note that some
    //  compilers can't deal with the fact that the pointer is to a const
    //  object, so we have to cast off the const'ness here!
    //
    if (fAdopt)
        delete (RefVectorOf<XMLAttr>*)fVector;

    fAdopt = adopt;
    fCount = count;
    fVector = srcVec;
    fScanner = scanner ;
}